

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_object_grow_and_rehash(JSON_Object *object)

{
  JSON_Value *value;
  bool bVar1;
  JSON_Status JVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  JSON_Object *pJVar7;
  JSON_Value *pJVar8;
  byte bVar9;
  JSON_Object new_object;
  JSON_Object local_70;
  
  bVar9 = 0;
  uVar4 = object->cell_capacity * 2;
  local_70.cell_capacity = 0x10;
  if (0x10 < uVar4) {
    local_70.cell_capacity = uVar4;
  }
  local_70.cell_ixs = (size_t *)0x0;
  local_70.count = 0;
  local_70.names = (char **)0x0;
  local_70.values = (JSON_Value **)0x0;
  local_70.cells = (size_t *)0x0;
  local_70.hashes = (unsigned_long *)0x0;
  local_70.item_capacity = (local_70.cell_capacity * 7) / 10 & 0xffffffff;
  local_70.cells = (size_t *)(*parson_malloc)(local_70.cell_capacity * 8);
  local_70.names = (char **)(*parson_malloc)(local_70.item_capacity << 3);
  local_70.values = (JSON_Value **)(*parson_malloc)(local_70.item_capacity << 3);
  local_70.cell_ixs = (size_t *)(*parson_malloc)(local_70.item_capacity << 3);
  local_70.hashes = (unsigned_long *)(*parson_malloc)(local_70.item_capacity << 3);
  if ((((local_70.cells == (size_t *)0x0) || (local_70.names == (char **)0x0)) ||
      (local_70.values == (JSON_Value **)0x0)) ||
     (local_70.hashes == (unsigned_long *)0x0 || local_70.cell_ixs == (size_t *)0x0)) {
    (*parson_free)(local_70.cells);
    (*parson_free)(local_70.names);
    (*parson_free)(local_70.values);
    (*parson_free)(local_70.cell_ixs);
    (*parson_free)(local_70.hashes);
LAB_0017c061:
    JVar2 = -1;
  }
  else {
    if (local_70.cell_capacity != 0) {
      uVar4 = 1;
      uVar5 = 0;
      do {
        uVar3 = uVar4;
        local_70.cells[uVar5] = 0xffffffffffffffff;
        uVar4 = (ulong)((int)uVar3 + 1);
        uVar5 = uVar3;
      } while (uVar3 < local_70.cell_capacity);
    }
    if (object == (JSON_Object *)0x0) {
      pJVar8 = (JSON_Value *)0x0;
    }
    else {
      pJVar8 = object->wrapping_value;
    }
    local_70.wrapping_value = pJVar8;
    if (object->count != 0) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        value = object->values[uVar4];
        JVar2 = json_object_add(&local_70,object->names[uVar4],value);
        if (JVar2 != 0) {
          json_object_deinit(&local_70,0,0);
          goto LAB_0017c061;
        }
        value->parent = pJVar8;
        bVar1 = uVar5 < object->count;
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar1);
    }
    JVar2 = 0;
    json_object_deinit(object,0,0);
    pJVar7 = &local_70;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      object->wrapping_value = pJVar7->wrapping_value;
      pJVar7 = (JSON_Object *)((long)pJVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      object = (JSON_Object *)((long)object + (ulong)bVar9 * -0x10 + 8);
    }
  }
  return JVar2;
}

Assistant:

static JSON_Status json_object_grow_and_rehash(JSON_Object *object) {
    JSON_Value *wrapping_value = NULL;
    JSON_Object new_object;
    char *key = NULL;
    JSON_Value *value = NULL;
    unsigned int i = 0;
    size_t new_capacity = MAX(object->cell_capacity * 2, STARTING_CAPACITY);
    JSON_Status res = json_object_init(&new_object, new_capacity);
    if (res != JSONSuccess) {
        return JSONFailure;
    }

    wrapping_value = json_object_get_wrapping_value(object);
    new_object.wrapping_value = wrapping_value;

    for (i = 0; i < object->count; i++) {
        key = object->names[i];
        value = object->values[i];
        res = json_object_add(&new_object, key, value);
        if (res != JSONSuccess) {
            json_object_deinit(&new_object, PARSON_FALSE, PARSON_FALSE);
            return JSONFailure;
        }
        value->parent = wrapping_value;
    }
    json_object_deinit(object, PARSON_FALSE, PARSON_FALSE);
    *object = new_object;
    return JSONSuccess;
}